

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node parse_subexpr(Parser *psr,Precedence minimum)

{
  uint64_t uVar1;
  BcIns *pBVar2;
  Node *node;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  undefined1 uVar6;
  NodeType NVar7;
  Precedence minimum_00;
  undefined4 uVar8;
  BcOp BVar9;
  uint uVar10;
  int iVar11;
  anon_union_8_6_f630ca3c_for_Node_1 aVar12;
  Precedence PVar13;
  Node *node_00;
  long lVar14;
  ulong uVar15;
  Lexer *pLVar16;
  bool bVar17;
  Node NVar18;
  Node NVar19;
  Node left;
  Node local_78;
  Node local_68;
  Node local_58;
  Precedence local_3c;
  Lexer *local_38;
  
  iVar11 = (psr->lxr).tk.type;
  if (iVar11 < 0x113) {
    if (iVar11 != 0x21) {
      if (iVar11 == 0x28) {
        pLVar16 = &psr->lxr;
        lex_next(pLVar16);
        NVar18 = parse_subexpr(psr,PREC_NONE);
        aVar12 = NVar18.field_1;
        NVar7 = NVar18.type;
        lex_expect(pLVar16,0x29);
        lex_next(pLVar16);
        goto LAB_00164c24;
      }
      if (iVar11 != 0x2d) goto switchD_00164a7a_default;
    }
    lex_next(&psr->lxr);
    NVar18 = parse_subexpr(psr,PREC_UNARY);
    local_68.field_1 = NVar18.field_1;
    local_68.type = NVar18.type;
    if (iVar11 == 0x21) {
      expr_to_jmp(psr,&local_68);
      local_68.field_1 =
           (anon_union_8_6_f630ca3c_for_Node_1)
           ((long)local_68.field_1 << 0x20 | (ulong)local_68.field_1 >> 0x20);
    }
    else {
      if (iVar11 != 0x2d) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x432,"void expr_emit_unary(Parser *, Tk, Node *)");
      }
      if (local_68.type == NODE_NUM) {
        local_68.field_1.num = local_68.field_1.num ^ 0x8000000000000000;
      }
      else {
        if (local_68.type == NODE_PRIM) {
          psr_trigger_err(psr,"invalid operand to unary operator");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                        ,0x40e,"void expr_emit_neg(Parser *, Node *)");
        }
        expr_discharge(psr,&local_68);
        if (local_68.type == NODE_NON_RELOC) {
          uVar6 = local_68.field_1.slot;
        }
        else {
          uVar6 = expr_to_next_slot(psr,&local_68);
        }
        expr_free_node(psr,&local_68);
        iVar11 = fn_emit(psr->vm->fns + psr->scope->fn,(uint)(byte)uVar6 << 0x10 | 0xe);
        local_68.type = NODE_RELOC;
        local_68.field_1.reloc_idx = iVar11;
      }
    }
  }
  else {
    switch(iVar11) {
    case 0x113:
      lex_next(&psr->lxr);
      iVar11 = parse_fn_args_body(psr);
      uVar10 = fn_emit(psr->vm->fns + psr->scope->fn,iVar11 * 0x10000 + 3);
      aVar12.jmp.false_list = 0;
      aVar12.reloc_idx = uVar10;
      NVar7 = NODE_RELOC;
      break;
    case 0x114:
      uVar1 = (psr->lxr).tk.field_4.ident_hash;
      lex_next(&psr->lxr);
      iVar11 = psr->scope->first_local;
      uVar10 = 0xffffffff;
      if (iVar11 < psr->locals_count) {
        lVar14 = 0;
        do {
          if (psr->locals[iVar11 + lVar14].name == uVar1) {
            uVar10 = (uint)lVar14;
            break;
          }
          lVar14 = lVar14 + 1;
        } while ((long)psr->locals_count - (long)iVar11 != lVar14);
      }
      if (uVar10 == 0xffffffff) {
        psr_trigger_err(psr,"variable not defined");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x4a2,"Node expr_operand_name(Parser *)");
      }
      aVar12.prim = uVar10 & 0xff;
      aVar12.jmp.false_list = 0;
      NVar7 = NODE_LOCAL;
      break;
    case 0x115:
      aVar12 = *(anon_union_8_6_f630ca3c_for_Node_1 *)&(psr->lxr).tk.field_4;
      lex_next(&psr->lxr);
      NVar7 = NODE_NUM;
      break;
    case 0x116:
    case 0x117:
    case 0x118:
      aVar12.prim = iVar11 - 0x116;
      aVar12.jmp.false_list = 0;
      lex_next(&psr->lxr);
      NVar7 = NODE_PRIM;
      break;
    default:
switchD_00164a7a_default:
      psr_trigger_err(psr,"expected expression");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x4de,"Node expr_operand(Parser *)");
    }
LAB_00164c24:
    local_68.type = NVar7;
    local_68.field_1 = aVar12;
  }
  local_3c = minimum;
  if ((psr->lxr).tk.type == 0x28) {
    if (local_68.type != NODE_LOCAL) {
      psr_trigger_err(psr,"cannot call non-local type");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x43b,"void expr_postfix_fn_call(Parser *, Node *)");
    }
    pLVar16 = &psr->lxr;
    lex_next(pLVar16);
    uVar10 = psr->scope->next_slot;
    if ((psr->lxr).tk.type != 0x29) {
      do {
        NVar18 = parse_subexpr(psr,PREC_NONE);
        local_58.field_1 = NVar18.field_1;
        local_58.type = NVar18.type;
        expr_to_next_slot(psr,&local_58);
        if ((psr->lxr).tk.type == 0x2c) {
          lex_next(pLVar16);
        }
      } while ((psr->lxr).tk.type != 0x29);
    }
    lex_next(pLVar16);
    fn_emit(psr->vm->fns + psr->scope->fn,
            (psr->scope->next_slot - uVar10) * 0x1000000 +
            ((uVar10 & 0xff) << 0x10 | (uint)local_68.field_1.slot << 8) + 0x1f);
    local_68.type = NODE_NON_RELOC;
    local_68.field_1.slot = (char)uVar10;
    psr->scope->next_slot = (uVar10 & 0xff) + 1;
  }
  PVar13 = local_3c;
  local_78.type = local_68.type;
  local_78.field_1 = local_68.field_1;
  uVar10 = (psr->lxr).tk.type;
  minimum_00 = binop_prec(uVar10);
  if (minimum_00 <= PVar13) {
LAB_0016523a:
    NVar19._4_4_ = 0;
    NVar19.type = local_78.type;
    NVar19.field_1 = local_78.field_1;
    return NVar19;
  }
  pLVar16 = &psr->lxr;
  local_38 = pLVar16;
LAB_00164d2c:
  lex_next(pLVar16);
  uVar15 = (ulong)uVar10;
  if (uVar10 < 0x3f) {
    if ((0xac0000000000U >> (uVar15 & 0x3f) & 1) == 0) {
      if ((0x5000000000000000U >> (uVar15 & 0x3f) & 1) == 0) goto LAB_00164d6e;
      goto LAB_00164d7e;
    }
    if (local_78.type == NODE_NUM) goto LAB_00164da9;
    if (local_78.type == NODE_PRIM) {
      psr_trigger_err(psr,"invalid operand to binary operator");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x3ef,"void expr_emit_binary_left(Parser *, Tk, Node *)");
    }
LAB_00164d9e:
    expr_to_ins_arg(psr,&local_78);
  }
  else {
LAB_00164d6e:
    if (uVar10 - 0x106 < 4) {
LAB_00164d7e:
      if (local_78.type != NODE_NUM) {
        if ((((uVar10 - 0x106 < 4) || (uVar10 == 0x3e)) || (uVar10 == 0x3c)) &&
           (local_78.type == NODE_PRIM)) {
          psr_trigger_err(psr,"invalid operand to binary operator");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                        ,0x3f9,"void expr_emit_binary_left(Parser *, Tk, Node *)");
        }
        goto LAB_00164d9e;
      }
    }
    else {
      if ((uVar10 & 0xfffffffe) != 0x10a) goto LAB_00164d9e;
      expr_to_jmp(psr,&local_78);
    }
  }
LAB_00164da9:
  NVar18 = parse_subexpr(psr,minimum_00);
  aVar12 = NVar18.field_1;
  bVar17 = true;
  NVar7 = NVar18.type;
  if (0x3e < uVar10) {
code_r0x00164dcf:
    switch(uVar10) {
    case 0x106:
    case 0x107:
      goto switchD_00164ddd_caseD_106;
    case 0x108:
    case 0x109:
      goto switchD_00164ddd_caseD_108;
    case 0x10a:
      local_58.type = NVar7;
      local_58.field_1 = aVar12;
      expr_to_jmp(psr,&local_58);
      jmp_ensure_true_falls_through(psr,&local_78);
      uVar3 = local_78.field_1.jmp.false_list;
      jmp_list_patch(psr,local_78.field_1.reloc_idx,local_78.field_1.jmp.false_list + 1);
      local_78.field_1.prim = local_58.field_1.prim;
      iVar11 = jmp_list_merge(psr,uVar3,local_58.field_1.jmp.false_list);
      local_78.field_1.jmp.false_list = iVar11;
      goto LAB_00165223;
    case 0x10b:
      local_58.type = NVar7;
      local_58.field_1 = aVar12;
      expr_to_jmp(psr,&local_58);
      aVar12 = local_78.field_1;
      uVar3 = local_78.field_1.jmp.false_list;
      uVar15 = (ulong)(uint)local_78.field_1.jmp.false_list;
      if (local_78.field_1.reloc_idx < local_78.field_1.jmp.false_list) {
        lVar14 = (long)local_78.field_1.jmp.false_list;
        pBVar2 = psr->vm->fns[psr->scope->fn].ins;
        BVar9 = relop_invert((uint)(byte)pBVar2[lVar14 + -1]);
        pBVar2[lVar14 + -1] = pBVar2[lVar14 + -1] & 0xffffff00 | BVar9;
        uVar8 = uVar3;
        if (-1 < (long)aVar12) {
          uVar8 = ((psr->vm->fns[psr->scope->fn].ins[uVar15] >> 8) + uVar3) - 0x7fffff;
        }
        local_78.field_1.jmp.false_list = uVar8;
        jmp_list_append(psr,&local_78.field_1.reloc_idx,uVar3);
      }
      uVar3 = local_78.field_1.prim;
      jmp_list_patch(psr,local_78.field_1.jmp.false_list,local_78.field_1.prim + 1);
      local_78.field_1.jmp.false_list = local_58.field_1.jmp.false_list;
      uVar10 = jmp_list_merge(psr,uVar3,local_58.field_1.reloc_idx);
      goto LAB_0016521f;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x3de,"void expr_emit_binary(Parser *, Tk, Node *, Node)");
    }
  }
  if ((0xac0000000000U >> (uVar15 & 0x3f) & 1) == 0) {
    if ((0x5000000000000000U >> (uVar15 & 0x3f) & 1) == 0) goto code_r0x00164dcf;
    goto switchD_00164ddd_caseD_108;
  }
  NVar18._0_8_ = NVar18._0_8_ & 0xffffffff;
  NVar18.field_1.num = aVar12.num;
  expr_emit_arith(psr,uVar10,&local_78,NVar18);
  goto LAB_00165223;
switchD_00164ddd_caseD_106:
  bVar17 = false;
switchD_00164ddd_caseD_108:
  if ((bVar17) && (NVar7 == NODE_PRIM)) {
    psr_trigger_err(psr,"invalid operand to binary operator");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                  ,0x35d,"void expr_emit_rel(Parser *, Tk, Node *, Node)");
  }
  if (local_78.type != NVar7) {
LAB_00164e6a:
    if ((local_78.type < NODE_RELOC) && (local_78.type != NODE_LOCAL)) {
      if ((int)uVar10 < 0x106) {
        if (1 < uVar10 - 0x2a) {
          if (uVar10 == 0x3c) {
            uVar10 = 0x109;
          }
          else {
            if (uVar10 != 0x3e) {
LAB_001653c3:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                            ,0x14c,"Tk binop_invert_rel(Tk)");
            }
            uVar10 = 0x108;
          }
        }
      }
      else if (1 < uVar10 - 0x106) {
        if (uVar10 == 0x108) {
          uVar10 = 0x3e;
        }
        else {
          if (uVar10 != 0x109) goto LAB_001653c3;
          uVar10 = 0x3c;
        }
      }
      local_58.type = NVar7;
      local_68._4_4_ = local_78._4_4_;
      local_68.type = local_78.type;
      local_68.field_1.num = local_78.field_1.num;
      local_58.field_1 = aVar12;
    }
    else {
      local_58._4_4_ = local_78._4_4_;
      local_58.type = local_78.type;
      local_58.field_1.num = local_78.field_1.num;
      local_68.type = NVar7;
      local_68.field_1 = aVar12;
    }
    bVar4 = expr_to_ins_arg(psr,&local_58);
    bVar5 = expr_to_ins_arg(psr,&local_68);
    node_00 = &local_58;
    node = &local_68;
    if (bVar5 < bVar4) {
      node_00 = &local_68;
      node = &local_58;
    }
    expr_free_node(psr,node);
    expr_free_node(psr,node_00);
    pLVar16 = local_38;
    if (local_68.type == NODE_PRIM) {
      iVar11 = 2;
    }
    else {
      iVar11 = 0;
      if (local_68.type != NODE_NON_RELOC) {
        if (local_68.type != NODE_CONST) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                        ,0x388,"void expr_emit_rel(Parser *, Tk, Node *, Node)");
        }
        iVar11 = 1;
      }
    }
    BVar9 = binop_opcode(uVar10);
    fn_emit(psr->vm->fns + psr->scope->fn,(uint)bVar5 << 0x10 | (uint)bVar4 << 8 | iVar11 + BVar9);
    local_78.field_1.reloc_idx = fn_emit(psr->vm->fns + psr->scope->fn,0x1d);
    pBVar2 = psr->vm->fns[psr->scope->fn].ins;
    pBVar2[local_78.field_1.reloc_idx] =
         ~local_78.field_1.prim * 0x100 + (uint)(byte)pBVar2[local_78.field_1.reloc_idx] +
         0x7fffff00;
    local_78.type = NODE_JMP;
    local_78.field_1.jmp.false_list = 0xffffffff;
    PVar13 = local_3c;
    goto LAB_00165223;
  }
  if (local_78.type == NODE_PRIM) {
    if (uVar10 == 0x107) {
      bVar17 = local_78.field_1.prim != NVar18.field_1._0_4_;
    }
    else {
      if (uVar10 != 0x106) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x34b,"_Bool expr_fold_rel(Tk, Node *, Node)");
      }
      bVar17 = local_78.field_1.prim == NVar18.field_1._0_4_;
    }
    goto LAB_0016521c;
  }
  if (local_78.type != NODE_NUM) goto LAB_00164e6a;
  switch(uVar10) {
  case 0x106:
    bVar17 = aVar12.num == local_78.field_1.num;
    break;
  case 0x107:
    bVar17 = aVar12.num != local_78.field_1.num;
    break;
  case 0x108:
    bVar17 = aVar12.num < local_78.field_1.num;
    goto LAB_001651fe;
  case 0x109:
    bVar17 = local_78.field_1.num < aVar12.num;
LAB_001651fe:
    bVar17 = !bVar17;
    goto LAB_0016521c;
  default:
    if (uVar10 == 0x3c) {
      bVar17 = aVar12.num < local_78.field_1.num;
    }
    else {
      if (uVar10 != 0x3e) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x33e,"_Bool expr_fold_rel(Tk, Node *, Node)");
      }
      bVar17 = local_78.field_1.num < aVar12.num;
    }
    bVar17 = !bVar17 && local_78.field_1.num != aVar12.num;
    goto LAB_0016521c;
  }
  bVar17 = (bool)(-bVar17 & 1);
LAB_0016521c:
  local_78.type = NODE_PRIM;
  uVar10 = bVar17 | 2;
LAB_0016521f:
  local_78.field_1.prim = uVar10;
LAB_00165223:
  uVar10 = (psr->lxr).tk.type;
  minimum_00 = binop_prec(uVar10);
  if (minimum_00 <= PVar13) goto LAB_0016523a;
  goto LAB_00164d2c;
}

Assistant:

static Node parse_subexpr(Parser *psr, Precedence minimum) {
	// Parse the left operand to the binary operation
	Node left = expr_unary(psr);

	// Keep parsing binary operators until we encounter one with a precedence
	// less than the minimum
	// We need the explicit cast to an int, or else it tries to convert -1
	// returned by `binop_prec` into an unsigned value
	while (binop_prec(psr->lxr.tk.type) > minimum) {
		// Skip the binary operator token
		Tk binop = psr->lxr.tk.type;
		lex_next(&psr->lxr);

		// Some binary operations require us to emit code for the left operand
		// BEFORE we parse the right one
		expr_emit_binary_left(psr, binop, &left);

		// Parse the right operand to the binary operator
		Node right = parse_subexpr(psr, binop_prec(binop));

		// Emit bytecode for the whole binary operation
		expr_emit_binary(psr, binop, &left, right);
	}
	return left;
}